

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O3

void __thiscall
el::Configurations::unsafeSetGlobally
          (Configurations *this,ConfigurationType configurationType,string *value,
          bool includeGlobalLevel)

{
  char cVar1;
  undefined7 in_register_00000009;
  EnumType lIndex;
  ushort local_44;
  ConfigurationType local_42;
  undefined8 *local_40;
  undefined8 local_38;
  code *local_30;
  code *local_28;
  
  local_42 = configurationType;
  if ((int)CONCAT71(in_register_00000009,includeGlobalLevel) != 0) {
    unsafeSet(this,Global,configurationType,value);
  }
  local_44 = 2;
  local_38 = 0;
  local_40 = (undefined8 *)operator_new(0x20);
  *local_40 = this;
  local_40[1] = &local_44;
  local_40[2] = &local_42;
  local_40[3] = value;
  local_28 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/thekvs[P]uvccapture2/src/third_party/easylogging++/easylogging++.h:2972:40)>
             ::_M_invoke;
  local_30 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/thekvs[P]uvccapture2/src/third_party/easylogging++/easylogging++.h:2972:40)>
             ::_M_manager;
  do {
    cVar1 = (*local_28)(&local_40);
    if ((cVar1 != '\0') || (local_44 = local_44 * 2, 0x80 < local_44)) goto LAB_00140de9;
  } while (local_30 != (code *)0x0);
  std::__throw_bad_function_call();
LAB_00140de9:
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,3);
  }
  return;
}

Assistant:

void unsafeSetGlobally(ConfigurationType configurationType, const std::string& value, bool includeGlobalLevel) {
    if (includeGlobalLevel) {
      unsafeSet(Level::Global, configurationType, value);
    }
    base::type::EnumType lIndex = LevelHelper::kMinValid;
    LevelHelper::forEachLevel(&lIndex, [&](void) -> bool  {
      unsafeSet(LevelHelper::castFromInt(lIndex), configurationType, value);
      return false;  // Do not break lambda function yet as we need to set all levels regardless
    });
  }